

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O3

string * getDefaultOutputFileName(string *__return_storage_ptr__,string *TgtLang)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (TgtLang->_M_dataplus)._M_p;
  iVar1 = strcmp(pcVar2,"OPENMP");
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    iVar1 = strcmp(pcVar2,"NUMPY");
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "a.py";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
    iVar1 = strcmp(pcVar2,"OPENCL");
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "a.cl";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
    iVar1 = strcmp(pcVar2,"CUDA");
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "a.cu";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
    iVar1 = strcmp(pcVar2,"BANG");
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "a.mlu";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
    iVar1 = strcmp(pcVar2,"CCE");
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "a.cce";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
    iVar1 = strcmp(pcVar2,"TPU");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == 0) {
      pcVar3 = "a.jl";
      pcVar2 = "";
      goto LAB_0010dd6d;
    }
  }
  pcVar3 = "a.cpp";
  pcVar2 = "";
LAB_0010dd6d:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultOutputFileName(std::string &TgtLang) {
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    return "a.cpp";
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    return "a.py";
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    return "a.cl";
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    return "a.cu";
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    return "a.mlu";
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    return "a.cce";
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    return "a.jl";
  }
  return "a.cpp";
}